

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

OrphanBuilder *
capnp::_::OrphanBuilder::initStructList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,StructSize elementSize)

{
  undefined1 auVar1 [16];
  StructSize SVar2;
  uint uVar3;
  unsigned_long uVar4;
  int iVar5;
  word *pwVar6;
  uint amount;
  AllocateResult AVar7;
  anon_class_1_0_00000001 local_3e;
  anon_class_1_0_00000001 local_3d;
  StructSize local_3c;
  CapTableBuilder *local_38;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  local_3c = elementSize;
  local_38 = capTable;
  uVar3 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_1_>
                    (elementCount,&local_3d);
  SVar2 = local_3c;
  uVar4 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_2_>
                    ((ulong)(((uint)local_3c & 0xffff) + ((uint)local_3c >> 0x10)) * (ulong)uVar3,
                     &local_3e);
  amount = (int)uVar4 + 1;
  if (arena == (BuilderArena *)0x0) {
    if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
        (int)(__return_storage_ptr__->tag).content != 0) {
      WireHelpers::zeroObject((SegmentBuilder *)0x0,local_38,(WirePointer *)__return_storage_ptr__);
    }
    iVar5 = ((uint)(_DAT_00000028 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = _DAT_00000028;
    AVar7 = (AllocateResult)(auVar1 << 0x40);
    _DAT_00000028 = _DAT_00000028 + (ulong)amount * 8;
  }
  else {
    AVar7 = BuilderArena::allocate(arena,amount);
    iVar5 = -3;
  }
  pwVar6 = AVar7.words;
  *(int *)&(__return_storage_ptr__->tag).content = iVar5;
  *(int *)((long)&(__return_storage_ptr__->tag).content + 4) = (int)uVar4 * 8 + 7;
  *(uint *)&pwVar6->content = uVar3 << 2;
  *(StructDataWordCount *)((long)&pwVar6->content + 4) = local_3c.data;
  *(StructPointerCount *)((long)&pwVar6->content + 6) = SVar2.pointers;
  __return_storage_ptr__->segment = AVar7.segment;
  __return_storage_ptr__->capTable = local_38;
  __return_storage_ptr__->location = pwVar6;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initStructList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, StructSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initStructListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}